

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

char * Cba_ObjGetName(Cba_Ntk_t *p,int i)

{
  int iVar1;
  char *pcVar2;
  Vec_Str_t *p_00;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0xf1,"char *Cba_ObjNameStr(Cba_Ntk_t *, int)");
  }
  iVar1 = Cba_ObjName(p,i);
  pcVar2 = Cba_NtkStr(p,iVar1);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = Cba_ObjName(p,i);
    iVar1 = Cba_NameIsLegalInVerilog(pcVar2,iVar1);
    if (iVar1 == 0) {
      p_00 = Abc_NamBuffer(p->pDesign->pStrs);
      pcVar2 = Vec_StrPrintF(p_00,"\\%s ",pcVar2);
      return pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

char * Cba_ObjGetName( Cba_Ntk_t * p, int i )
{
    char * pName = Cba_ObjNameStr(p, i);
    if ( pName == NULL )
        return pName;
    if ( Cba_NameIsLegalInVerilog(pName, Cba_ObjName(p, i)) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s ", pName );
}